

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

TypedDeleter<LLVMBC::SelectInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::SelectInst>,LLVMBC::SelectInst*&>
          (LLVMContext *this,SelectInst **u)

{
  SelectInst *pSVar1;
  TypedDeleter<LLVMBC::SelectInst> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::SelectInst> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::SelectInst> *)0x0) {
    pSVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001e3780;
    pTVar2->ptr = pSVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}